

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
SetUnsignaled(RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *this)

{
  char (*in_RCX) [16];
  string msg;
  string local_30;
  
  if (this->m_IsUnsignaled == true) {
    Diligent::FormatString<char[26],char[16]>
              (&local_30,(Diligent *)"Debug expression failed:\n",(char (*) [26])"!m_IsUnsignaled",
               in_RCX);
    Diligent::DebugAssertionFailed
              (local_30._M_dataplus._M_p,"SetUnsignaled",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanSyncObjectManager.hpp"
               ,0x8d);
    std::__cxx11::string::~string((string *)&local_30);
  }
  this->m_IsUnsignaled = true;
  return;
}

Assistant:

void SetUnsignaled()
    {
        VERIFY_EXPR(!m_IsUnsignaled);
        m_IsUnsignaled = true;
    }